

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O0

QList<QPrint::ColorMode> * __thiscall
QPlatformPrintDevice::supportedColorModes(QPlatformPrintDevice *this)

{
  long *in_RSI;
  QList<QPrint::ColorMode> *in_RDI;
  QList<QPrint::ColorMode> *this_00;
  
  this_00 = in_RDI;
  if ((*(byte *)(in_RSI + 0x23) & 1) == 0) {
    (**(code **)(*in_RSI + 0x158))();
  }
  QList<QPrint::ColorMode>::QList(this_00,in_RDI);
  return this_00;
}

Assistant:

QList<QPrint::ColorMode> QPlatformPrintDevice::supportedColorModes() const
{
    if (!m_haveColorModes)
        loadColorModes();
    return m_colorModes;
}